

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O2

void Z80::OpCode_IN(void)

{
  bool bVar1;
  byte bVar2;
  char cVar3;
  Z80Reg ZVar4;
  undefined1 signedCheck;
  undefined8 in_RSI;
  char **in_RDI;
  Z80Reg ZVar5;
  undefined8 local_40;
  undefined4 local_38;
  
  do {
    signedCheck = (undefined1)in_RSI;
    local_38 = 0xffffffff;
    local_40 = 0xffffffffffffffff;
    ZVar4 = GetRegister(in_RDI);
    ZVar5 = Z80_F;
    if (ZVar4 != Z80_UNK) {
      bVar1 = comma(&lp);
      ZVar5 = ZVar4;
      if (bVar1) goto LAB_00131773;
      goto LAB_001317c0;
    }
LAB_00131773:
    if (Options::IsI8080 == '\0') {
      bVar1 = NeedIoC();
      if (!bVar1) goto LAB_001317a4;
      if ((uint)ZVar5 < 6) {
LAB_00131796:
        local_40 = CONCAT44(ZVar5 * 8 + 0x40,0xed);
      }
      else if (ZVar5 == Z80_F) {
        local_40 = 0x70000000ed;
      }
      else {
        if (ZVar5 == Z80_A) goto LAB_00131796;
        local_40 = CONCAT44(local_40._4_4_,0xffffffff);
      }
    }
    else {
LAB_001317a4:
      bVar2 = GetByte((char **)0x0,(bool)signedCheck);
      local_40 = (ulong)CONCAT14(bVar2,(int)local_40);
      if (ZVar5 == Z80_A) {
        local_40._4_4_ = (uint)bVar2;
        local_40 = CONCAT44(local_40._4_4_,0xdb);
      }
    }
LAB_001317c0:
    in_RSI = 1;
    EmitBytes((int *)&local_40,true);
    in_RDI = &lp;
    cVar3 = (*DAT_0018a520)();
    if (cVar3 == '\0') {
      return;
    }
  } while( true );
}

Assistant:

static void OpCode_IN() {
		do {
			int e[] { -1, -1, -1 };
			Z80Reg reg = GetRegister(lp);
			if (Z80_UNK == reg || comma(lp)) {
				if (Z80_UNK == reg) reg = Z80_F;	// if there was no register, it may be "IN (C)"
				if ((!Options::IsI8080) && NeedIoC()) {
					e[0] = 0xed;
					switch (reg) {
						case Z80_B: case Z80_C: case Z80_D: case Z80_E: case Z80_H: case Z80_L: case Z80_A:
							e[1] = 0x40 + reg*8;	// regular IN reg,(C)
							break;
						case Z80_F:
							e[1] = 0x70;			// unofficial IN F,(C)
							break;
						default:
							e[0] = -1;				// invalid combination
							break;
					}
				} else {
					e[1] = GetByte(lp);
					if (Z80_A == reg) e[0] = 0xdb;	// IN A,(n)
				}
			}
			EmitBytes(e, true);
		} while (Options::syx.MultiArg(lp));
	}